

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_control_main.c
# Opt level: O2

int main(int argc,char **argv)

{
  adt_str_t *paVar1;
  adt_str_t *paVar2;
  char cVar3;
  adt_error_t aVar4;
  uint uVar5;
  int iVar6;
  int32_t iVar7;
  char *__s1;
  long lVar8;
  undefined8 uVar9;
  adt_str_t *paVar10;
  message_client_connection_t *self;
  uint8_t addressFamily;
  int iVar11;
  char *__format;
  undefined4 in_register_0000003c;
  uint16_t dummy_port;
  
  m_connect_port = 0x13ec;
  uVar5 = argparse_exec(CONCAT44(in_register_0000003c,argc),argv,argparse_cbk);
  if (uVar5 != 0) {
    iVar11 = 0;
    printf("Error parsing argument (%d)\n",(ulong)uVar5);
    print_usage(*argv);
    goto switchD_00102659_default;
  }
  if (m_display_version == '\x01') {
    printf("%s %s\n","apx_control","0.3.1");
  }
  if (m_display_help == '\x01') {
LAB_00102409:
    print_usage(*argv);
    iVar11 = 0;
    goto switchD_00102659_default;
  }
  if ((m_connect_resource_type == '\0') &&
     ((m_connect_resource_type =
            apx_parse_resource_name("/tmp/apx_node.socket",&m_connect_address,&dummy_port),
      m_connect_resource_type == '\x05' || (m_connect_resource_type == '\0')))) {
    __assert_fail("(m_connect_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_connect_resource_type != APX_RESOURCE_TYPE_ERROR)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_control/src/apx_control_main.c"
                  ,0x81,"int main(int, char **)");
  }
  paVar2 = m_value;
  paVar1 = m_name;
  if (m_input_file_path == (adt_str_t *)0x0) {
    if (m_name == (adt_str_t *)0x0) goto LAB_0010260c;
    if (m_value == (adt_str_t *)0x0) {
      puts("Error: missing value argument");
      goto LAB_00102409;
    }
    paVar10 = (adt_str_t *)adt_str_new();
    cVar3 = adt_str_push(paVar10,0x7b);
    if ((((cVar3 == '\0') && (cVar3 = adt_str_push(paVar10,0x22), cVar3 == '\0')) &&
        (cVar3 = adt_str_append(paVar10,paVar1), cVar3 == '\0')) &&
       (((cVar3 = adt_str_push(paVar10,0x22), cVar3 == '\0' &&
         (cVar3 = adt_str_push(paVar10,0x3a), cVar3 == '\0')) &&
        ((cVar3 = adt_str_append(paVar10,paVar2), cVar3 == '\0' &&
         (cVar3 = adt_str_push(paVar10,0x7d), cVar3 == '\0')))))) {
      uVar9 = adt_str_cstr(paVar10);
      lVar8 = dtl_json_load_cstr(uVar9);
      if (lVar8 != 0) {
        dtl_dv_dec_ref(lVar8);
        m_message = paVar10;
        goto LAB_0010260c;
      }
      fwrite("Error: Failed to validate JSON data\n",0x24,1,_stderr);
    }
LAB_00102742:
    iVar11 = -1;
    goto switchD_00102659_default;
  }
  __s1 = (char *)adt_str_cstr();
  lVar8 = ifstream_util_readTextFile(__s1);
  if (lVar8 != 0) {
    m_message = (adt_str_t *)adt_str_new_bytearray(lVar8);
    adt_bytearray_delete(lVar8);
    if (m_message == (adt_str_t *)0x0) goto LAB_001025ea;
    uVar9 = adt_str_cstr();
    lVar8 = dtl_json_load_cstr(uVar9);
    if (lVar8 != 0) {
      dtl_dv_dec_ref(lVar8);
      goto LAB_0010260c;
    }
    __format = "Error: JSON data validation error while parsing %s\n";
LAB_0010273b:
    fprintf(_stderr,__format,__s1);
    goto LAB_00102742;
  }
LAB_001025ea:
  fprintf(_stderr,"Error: Failed to read contents of file %s\n",__s1);
LAB_0010260c:
  if (((m_message == (adt_str_t *)0x0) || (m_connect_resource_type == '\0')) ||
     (m_connect_resource_type == '\x05')) {
    iVar11 = 0;
    if (((m_message == (adt_str_t *)0x0) && (m_display_version == '\0')) && (m_display_help == '\0')
       ) {
      puts("No message to send");
    }
    goto switchD_00102659_default;
  }
  __s1 = (char *)adt_str_cstr(m_connect_address);
  if (__s1 == (char *)0x0) {
    __assert_fail("address != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_control/src/apx_control_main.c"
                  ,0xb4,"int main(int, char **)");
  }
  iVar11 = 0;
  switch(m_connect_resource_type) {
  case '\x01':
    addressFamily = '\x02';
    break;
  case '\x02':
    addressFamily = '\n';
    break;
  case '\x03':
    self = message_client_connection_new('\x01');
    if (m_message == (adt_str_t *)0x0) {
      __assert_fail("m_message != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_control/src/apx_control_main.c"
                    ,0x19a,"void connect_and_send_message_unix(const char *)");
    }
    if (self != (message_client_connection_t *)0x0) {
      aVar4 = message_client_prepare_message(self,m_message);
      if (aVar4 == '\0') {
        iVar7 = message_client_connect_unix(self,__s1);
        if (iVar7 == 0) {
          uVar5 = message_client_wait_for_message_transmitted(self);
          if (uVar5 != 0) {
            printf("message_client_wait_for_message_transmitted failed with %d\n",(ulong)uVar5);
          }
        }
        else {
          printf("Failed to connect at %s\n",__s1);
        }
      }
      else {
        puts("Failed to prepare data");
      }
      message_client_connection_delete(self);
    }
    goto switchD_00102659_default;
  case '\x04':
    if ((*__s1 != '\0') && (iVar6 = strcmp(__s1,"localhost"), iVar6 != 0)) {
      __format = "Error: Unsupported connection name \"%s\"\n";
      goto LAB_0010273b;
    }
    __s1 = "127.0.0.1";
    addressFamily = '\x02';
    break;
  default:
    goto switchD_00102659_default;
  }
  connect_and_send_message_tcp(__s1,m_connect_port,addressFamily);
switchD_00102659_default:
  if (m_connect_address != (adt_str_t *)0x0) {
    adt_str_delete();
  }
  if (m_message != (adt_str_t *)0x0) {
    adt_str_delete();
  }
  if (m_input_file_path != (adt_str_t *)0x0) {
    adt_str_delete();
  }
  return iVar11;
}

Assistant:

int main(int argc, char **argv)
{
   m_connect_port = connect_port_default;
   int retval = 0;
   argparse_result_t result = argparse_exec(argc, (const char**) argv, argparse_cbk);
   if (result == ARGPARSE_SUCCESS)
   {
#ifdef _WIN32
      if (init_wsa() != 0)
      {
         int err = WSAGetLastError();
         fprintf(stderr, "WSAStartup failed with error: %d\n", err);
         retval = 1;
         goto SHUTDOWN;
      }
#endif
      if (m_display_version)
      {
         print_version();
      }
      if (m_display_help)
      {
         print_usage(argv[0]);
      }
      else
      {
         if (m_connect_resource_type == APX_RESOURCE_TYPE_UNKNOWN)
         {
            uint16_t dummy_port;
            m_connect_resource_type = apx_parse_resource_name(m_connect_address_default, &m_connect_address, &dummy_port);
            (void) dummy_port;
            assert( (m_connect_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_connect_resource_type != APX_RESOURCE_TYPE_ERROR) );
         }
         if (m_input_file_path != 0)
         {
            const char *input_file_path = adt_str_cstr(m_input_file_path);
            result = read_message_from_file(input_file_path);

            if (result != APX_NO_ERROR)
            {
               fprintf(stderr, "Error: Failed to read contents of file %s\n", input_file_path);
            }
            else
            {
               dtl_dv_t *dv = dtl_json_load_cstr(adt_str_cstr(m_message));
               if (dv == 0)
               {
                  fprintf(stderr, "Error: JSON data validation error while parsing %s\n", input_file_path);
                  retval = -1;
                  goto SHUTDOWN;
               }
               else
               {
                  dtl_dec_ref(dv);
               }
            }
         }
         else
         {
            if (m_name != 0)
            {
               if (m_value == 0)
               {
                  printf("Error: missing value argument\n");
                  print_usage(argv[0]);
                  goto SHUTDOWN;
               }
               else
               {
                  result = build_json_message(m_name, m_value);
                  if (result != ADT_NO_ERROR)
                  {
                     retval = -1;
                     goto SHUTDOWN;
                  }
               }
            }
         }
         if ( (m_message != 0) && (m_connect_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_connect_resource_type != APX_RESOURCE_TYPE_ERROR) )
         {
            const char *address;
            address = adt_str_cstr(m_connect_address);
            assert(address != 0);
            switch(m_connect_resource_type)
            {
            case APX_RESOURCE_TYPE_IPV4: //fall-trough
               connect_and_send_message_tcp(address, m_connect_port, AF_INET);
               break;
            case APX_RESOURCE_TYPE_IPV6:
               connect_and_send_message_tcp(address, m_connect_port, AF_INET6);
               break;
            case APX_RESOURCE_TYPE_FILE:
   #ifdef _WIN32
               printf("UNIX domain socket path not supported in Windows\n");
   #else
               connect_and_send_message_unix(address);
   #endif
               break;
            case APX_RESOURCE_TYPE_NAME:
               if ( (strlen(address) == 0) || (strcmp(address, "localhost") == 0) )
               {
                  connect_and_send_message_tcp("127.0.0.1", m_connect_port, AF_INET);
               }
               else
               {
                  fprintf(stderr, "Error: Unsupported connection name \"%s\"\n", address);
                  retval = -1;
               }
               break;
            }
         }
         else if (m_message == 0)
         {
            if (!m_display_version && !m_display_help)
            {
               printf("No message to send\n");
            }
         }
      }
   }
   else
   {
      printf("Error parsing argument (%d)\n", (int) result);
      print_usage(argv[0]);
   }
SHUTDOWN:
   application_cleanup();
   return retval;
}